

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansequence.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  ulong uVar5;
  ssize_t sVar6;
  ifreq *__cmsg;
  int *piVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  size_t sVar14;
  bool bVar15;
  bool bVar16;
  ulong local_320;
  undefined4 local_314;
  ulong local_310;
  int dropmonitor_on;
  int enable_canfd;
  undefined4 uStack_2fc;
  socklen_t local_2f8;
  iovec *local_2f0;
  size_t local_2e8;
  ifreq *local_2e0;
  ulong local_2d8;
  int local_2d0;
  sockaddr_can addr;
  ifreq ifr;
  iovec iov;
  sigaction act;
  option long_options [12];
  
  memcpy(&act,&PTR_sig_handler_00103bb0,0x98);
  addr.can_family = 0x1d;
  addr._2_2_ = 0;
  addr.can_ifindex = 0;
  addr.can_addr.j1939.name = 0;
  addr.can_addr._8_8_ = 0;
  bVar16 = false;
  sigaction(2,(sigaction *)&act,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&act,(sigaction *)0x0);
  sigaction(1,(sigaction *)&act,(sigaction *)0x0);
  memcpy(long_options,&PTR_anon_var_dwarf_4e_00103c50,0x180);
  bVar15 = false;
  bVar1 = false;
switchD_001014ec_caseD_65:
  bVar2 = bVar1;
  iVar3 = getopt_long(argc,argv,"efsbi:pq::rvh?",long_options);
  bVar1 = true;
  switch(iVar3) {
  case 0x62:
    canfd = '\x01';
    bVar16 = true;
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 99:
  case 100:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x74:
  case 0x75:
    goto switchD_001014ec_caseD_63;
  case 0x65:
    goto switchD_001014ec_caseD_65;
  case 0x66:
    canfd = '\x01';
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 0x68:
    goto switchD_001014ec_caseD_68;
  case 0x69:
    uVar5 = strtoul(_optarg,(char **)0x0,0);
    filter[0].can_id = (canid_t)uVar5;
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 0x6c:
    if (_optarg == (char *)0x0) {
      infinite = '\0';
      bVar1 = bVar2;
    }
    else {
      uVar5 = strtoul(_optarg,(char **)0x0,0);
      loopcount = (uint)uVar5;
      infinite = '\x01';
      bVar1 = bVar2;
    }
    goto switchD_001014ec_caseD_65;
  case 0x70:
    use_poll = '\x01';
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 0x71:
    if (_optarg == (char *)0x0) {
      drop_until_quit = 1;
      bVar1 = bVar2;
    }
    else {
      uVar5 = strtoul(_optarg,(char **)0x0,0);
      drop_until_quit = (uint)uVar5;
      bVar1 = bVar2;
    }
    goto switchD_001014ec_caseD_65;
  case 0x72:
    bVar15 = true;
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 0x73:
    canfd_strict = 1;
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  case 0x76:
    verbose = verbose + 1;
    bVar1 = bVar2;
    goto switchD_001014ec_caseD_65;
  default:
    if (iVar3 != -1) goto LAB_00101c32;
    pcVar11 = "can0";
    if (argv[_optind] != (char *)0x0) {
      pcVar11 = argv[_optind];
    }
    uVar8 = filter[0].can_id & 0x1fffffff;
    filter[0].can_id = filter[0].can_id & 0x7ff;
    if (bVar2) {
      filter[0].can_id = uVar8 | 0x80000000;
    }
    filter[0].can_mask = 0x800007ff;
    if (bVar2) {
      filter[0].can_mask = 0x9fffffff;
    }
    frame.can_id = filter[0].can_id;
    printf("interface = %s\n",pcVar11);
    iVar3 = socket(0x1d,3,1);
    s = iVar3;
    if (iVar3 < 0) goto LAB_00101c6d;
    iVar4 = strcmp("any",pcVar11);
    if (iVar4 != 0) {
      uVar8 = if_nametoindex(pcVar11);
      addr.can_ifindex = uVar8;
      iVar3 = s;
      if (uVar8 == 0) goto LAB_00101c7c;
    }
    iVar3 = setsockopt(iVar3,0x65,1,(void *)0x0,0);
    if (iVar3 != 0) goto LAB_00101c72;
    if (canfd == '\x01') {
      _enable_canfd = (void *)CONCAT44(uStack_2fc,1);
      strncpy((char *)&ifr,pcVar11,0x10);
      iVar3 = ioctl(s,0x8921,&ifr);
      if (iVar3 < 0) goto LAB_00101c81;
      if ((ifr.ifr_ifru.ifru_ivalue != 0x48) && (ifr.ifr_ifru.ifru_ivalue != 0x80c))
      goto LAB_00101c90;
      iVar3 = setsockopt(s,0x65,5,&enable_canfd,4);
      if (iVar3 != 0) {
        pcVar11 = "error when enabling CAN FD support";
        goto LAB_00101c97;
      }
    }
    else {
      canfd_strict = 0;
    }
    if (bVar16) {
      frame.flags = frame.flags | 1;
    }
    iVar3 = bind(s,(sockaddr *)&addr,0x18);
    if (iVar3 < 0) goto LAB_00101c77;
    if (!bVar15) {
      argv = (char **)0x10;
      if (canfd != '\0') {
        argv = (char **)&DAT_00000048;
      }
      bVar9 = 0;
      while (((infinite != '\x01' || (bVar16 = loopcount != 0, loopcount = loopcount - 1, bVar16))
             && (running == '\0'))) {
        if (1 < verbose) {
          printf("sending frame. sequence number: %d\n",(ulong)bVar9);
        }
        sVar6 = write(s,&frame,(size_t)argv);
        if (sVar6 == -1) {
          piVar7 = __errno_location();
          do {
            if (*piVar7 == 4) goto LAB_00101b95;
            if (*piVar7 != 0x69) {
LAB_00101c28:
              main_cold_5();
LAB_00101c2d:
              main_cold_3();
              iVar3 = extraout_EAX;
              goto LAB_00101c32;
            }
            ifr.ifr_ifrn._0_4_ = s;
            ifr.ifr_ifrn._4_4_ = 4;
            if (use_poll == '\0') goto LAB_00101c2d;
            iVar3 = poll((pollfd *)&ifr,1,1000);
            if (iVar3 == -1) {
              if (*piVar7 != 4) goto LAB_00101c23;
            }
            else if (iVar3 == 0) {
LAB_00101c23:
              main_cold_4();
              goto LAB_00101c28;
            }
LAB_00101b95:
            sVar6 = write(s,&frame,(size_t)argv);
          } while (sVar6 == -1);
        }
        frame.data[0] = frame.data[0] + '\x01';
        bVar9 = bVar9 + 1;
        if (bVar9 == 0 && verbose != 0) {
          printf("sequence wrap around (%d)\n");
        }
      }
      goto LAB_00101bee;
    }
    local_2f0 = &iov;
    iov.iov_base = &frame;
    iov.iov_len = 0;
    _enable_canfd = (void *)0x0;
    local_2f8 = 0;
    local_2e8 = 1;
    local_2e0 = &ifr;
    dropmonitor_on = 1;
    local_314 = 0x1fffffff;
    sVar14 = 0x10;
    if (canfd != '\0') {
      sVar14 = 0x48;
    }
    iVar3 = setsockopt(s,1,0x28,&dropmonitor_on,4);
    if (iVar3 < 0) {
      perror("setsockopt() SO_RXQ_OVFL not supported by your Linux Kernel");
    }
    iVar3 = setsockopt(s,0x65,2,&local_314,4);
    if (iVar3 != 0) goto LAB_00101c86;
    iVar3 = setsockopt(s,0x65,1,filter,8);
    if (iVar3 != 0) goto LAB_00101c8b;
    bVar16 = true;
    uVar5 = 0;
    iVar3 = 0;
  }
LAB_00101888:
  if (((infinite == '\x01') && (bVar15 = loopcount == 0, loopcount = loopcount - 1, bVar15)) ||
     (running != '\0')) goto LAB_00101bee;
  local_2f0->iov_len = sVar14;
  local_2d8 = 0x38;
  local_2d0 = 0;
  sVar6 = recvmsg(s,(msghdr *)&enable_canfd,0);
  if (sVar6 < 0) {
    main_cold_9();
LAB_00101c6d:
    main_cold_12();
LAB_00101c72:
    main_cold_2();
LAB_00101c77:
    main_cold_10();
LAB_00101c7c:
    main_cold_1();
LAB_00101c81:
    main_cold_11();
LAB_00101c86:
    main_cold_6();
LAB_00101c8b:
    main_cold_7();
LAB_00101c90:
    pcVar11 = "CAN interface is only Classical CAN capable - sorry.";
LAB_00101c97:
    puts(pcVar11);
    goto LAB_00101c5e;
  }
  if ((frame.can_id >> 0x1d & 1) != 0) {
    main_cold_8();
    goto LAB_00101888;
  }
  uVar8 = (uint)frame.data[0];
  if ((sVar6 == 0x10) && ((canfd_strict & 1) != 0)) {
    if (1 < verbose) {
      printf("sequence CNT: 0x%07x  RX: 0x%02x (ignoring classical CAN frame)\n",uVar5,(ulong)uVar8)
      ;
    }
    goto LAB_00101888;
  }
  uVar13 = (uint)uVar5;
  if (bVar16) {
    uVar13 = uVar8;
  }
  bVar9 = frame.data[0] - (char)uVar13;
  if (bVar9 == 0) {
    if (1 < verbose) {
      printf("sequence CNT: 0x%07x  RX: 0x%02x\n",(ulong)uVar13,(ulong)uVar8);
    }
  }
  else {
    drop_count = drop_count + 1;
    local_320 = 0;
    __cmsg = local_2e0;
    if (local_2e0 != (ifreq *)0x0 && 0xf < local_2d8) {
      do {
        if (*(int *)((long)&__cmsg->ifr_ifrn + 8) != 1) break;
        if (*(int *)((long)&__cmsg->ifr_ifrn + 0xc) == 0x28) {
          local_320 = (ulong)(uint)(__cmsg->ifr_ifru).ifru_ivalue;
          break;
        }
        __cmsg = (ifreq *)__cmsg_nxthdr((msghdr *)&enable_canfd,(cmsghdr *)__cmsg);
      } while (__cmsg != (ifreq *)0x0);
    }
    local_310 = (ulong)drop_count;
    uVar10 = (int)local_320 - iVar3;
    pcVar11 = "[SOCKET]";
    if (uVar10 == 0) {
      pcVar11 = "";
    }
    pcVar12 = "[HARDWARE]";
    if ((byte)uVar10 == bVar9) {
      pcVar12 = "[HARDWARE?]";
    }
    if (uVar10 - bVar9 == 0) {
      pcVar12 = "";
    }
    fprintf(_stderr,
            "sequence CNT: 0x%07x  RX: 0x%02x  expected: 0x%02x  missing: %4u   skt overflow delta: %4u  absolute: %4u   hw - skt: %5d   incident: %4u %s%s\n"
            ,(ulong)uVar13,(ulong)uVar8,(ulong)(uVar13 & 0xff),(ulong)bVar9,(ulong)uVar10,local_320,
            (ulong)-(uVar10 - bVar9),local_310,pcVar11,pcVar12);
    uVar13 = uVar8;
    iVar3 = (int)local_320;
    if (drop_count == drop_until_quit) goto LAB_00101c5e;
  }
  uVar5 = (ulong)(uVar13 + 1);
  bVar16 = false;
  if ((verbose != 0) && ((uVar13 + 1 & 0xff) == 0)) {
    bVar16 = false;
    printf("sequence wrap around (%d)\n");
  }
  goto LAB_00101888;
LAB_00101bee:
  if (signal_num != 0) {
    return signal_num + 0x80;
  }
  goto LAB_00101c47;
LAB_00101c32:
  if (iVar3 != 0x3f) {
switchD_001014ec_caseD_63:
    pcVar11 = __xpg_basename(*argv);
    print_usage(pcVar11);
LAB_00101c5e:
    exit(1);
  }
switchD_001014ec_caseD_68:
  pcVar11 = __xpg_basename(*argv);
  print_usage(pcVar11);
LAB_00101c47:
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	struct sigaction act = {
		.sa_handler = sig_handler,
	};
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	char *interface = "can0";
	bool extended = false;
	bool brs = false;
	bool receive = false;
	int opt;

	sigaction(SIGINT, &act, NULL);
	sigaction(SIGTERM, &act, NULL);
	sigaction(SIGHUP, &act, NULL);

	struct option long_options[] = {
		{ "extended", no_argument, 0, 'e' },
		{ "canfd", no_argument, 0, 'f' },
		{ "strict", no_argument, 0, 's' },
		{ "brs", no_argument, 0, 'b' },
		{ "identifier", required_argument, 0, 'i' },
		{ "loop", required_argument, 0, 'l' },
		{ "poll", no_argument, 0, 'p' },
		{ "quit", optional_argument, 0, 'q' },
		{ "receive", no_argument, 0, 'r' },
		{ "verbose", no_argument, 0, 'v' },
		{ "help", no_argument, 0, 'h' },
		{ 0, 0, 0, 0 },
	};

	while ((opt = getopt_long(argc, argv, "efsbi:pq::rvh?", long_options, NULL)) != -1) {
		switch (opt) {
		case 'e':
			extended = true;
			break;

		case 'f':
			canfd = true;
			break;

		case 's':
			canfd_strict = true;
			break;

		case 'b':
			brs = true; /* bitrate switch implies CAN-FD */
			canfd = true;
			break;

		case 'i':
			filter->can_id = strtoul(optarg, NULL, 0);
			break;

		case 'r':
			receive = true;
			break;

		case 'l':
			if (optarg) {
				loopcount = strtoul(optarg, NULL, 0);
				infinite = false;
			} else {
				infinite = true;
			}
			break;

		case 'p':
			use_poll = true;
			break;

		case 'q':
			if (optarg)
				drop_until_quit = strtoul(optarg, NULL, 0);
			else
				drop_until_quit = 1;
			break;

		case 'v':
			verbose++;
			break;

		case 'h':
		case '?':
			print_usage(basename(argv[0]));
			exit(EXIT_SUCCESS);
			break;

		default:
			print_usage(basename(argv[0]));
			exit(EXIT_FAILURE);
			break;
		}
	}

	if (argv[optind] != NULL)
		interface = argv[optind];

	if (extended) {
		filter->can_mask = CAN_EFF_MASK;
		filter->can_id &= CAN_EFF_MASK;
		filter->can_id |= CAN_EFF_FLAG;
	} else {
		filter->can_mask = CAN_SFF_MASK;
		filter->can_id &= CAN_SFF_MASK;
	}
	frame.can_id = filter->can_id;
	filter->can_mask |= CAN_EFF_FLAG;

	printf("interface = %s\n", interface);

	s = socket(AF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket()");
		exit(EXIT_FAILURE);
	}

	if (strcmp(ANYDEV, interface)) {
		addr.can_ifindex = if_nametoindex(interface);
		if (!addr.can_ifindex) {
			perror("if_nametoindex()");
			exit(EXIT_FAILURE);
		}
	}

	/* first don't recv. any msgs */
	if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0)) {
		perror("setsockopt()");
		exit(EXIT_FAILURE);
	}

	if (canfd) {
		const int enable_canfd = 1;
		struct ifreq ifr;

		strncpy(ifr.ifr_name, interface, sizeof(ifr.ifr_name));

		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			exit(EXIT_FAILURE);
		}

		if (ifr.ifr_mtu != CANFD_MTU && ifr.ifr_mtu != CANXL_MTU) {
			printf("CAN interface is only Classical CAN capable - sorry.\n");
			exit(EXIT_FAILURE);
		}

		/* interface is ok - try to switch the socket into CAN FD mode */
		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &enable_canfd, sizeof(enable_canfd))) {
			printf("error when enabling CAN FD support\n");
			exit(EXIT_FAILURE);
		}
	} else {
		canfd_strict = false;
	}

	if (brs)
		frame.flags |= CANFD_BRS;

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind()");
		exit(EXIT_FAILURE);
	}

	if (receive)
		do_receive();
	else
		do_send();

	if (signal_num)
		return 128 + signal_num;

	exit(EXIT_SUCCESS);
}